

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  FilePath *in_RDI;
  FilePath result;
  FilePath FStack_48;
  FilePath local_28;
  
  FilePath::FilePath(&FStack_48);
  FilePath::FilePath(&local_28,g_argvs_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&FStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  FilePath::RemoveDirectoryName(in_RDI,&FStack_48);
  std::__cxx11::string::~string((string *)&FStack_48);
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}